

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_namer.h
# Opt level: O0

string * __thiscall
flatbuffers::BfbsNamer::Field_abi_cxx11_(string *__return_storage_ptr__,BfbsNamer *this,Field *f)

{
  String *this_00;
  string local_40;
  Field *local_20;
  Field *f_local;
  BfbsNamer *this_local;
  
  local_20 = f;
  f_local = (Field *)this;
  this_local = (BfbsNamer *)__return_storage_ptr__;
  this_00 = reflection::Field::name(f);
  String::str_abi_cxx11_(&local_40,this_00);
  (*(this->super_Namer)._vptr_Namer[0x12])(__return_storage_ptr__,this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string Field(const ::reflection::Field &f) const {
    return Field(f.name()->str());
  }